

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ProcessEnergy
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  undefined8 uVar3;
  int iVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  Value *pVVar6;
  char *pcVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EnergyReport *aEnergyReport;
  EnergyReportMap *aEnergyReportMap;
  undefined1 *puVar8;
  char *pcVar9;
  undefined1 *puVar10;
  _Alloc_hider _Var11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar12;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  uint8_t count;
  uint16_t scanDuration;
  uint16_t period;
  Address dstAddr;
  uint32_t channelMask;
  CommissionerAppPtr commissioner;
  byte local_2e1;
  Expression *local_2e0;
  string *local_2d8;
  string *local_2d0;
  ushort local_2c4;
  ushort local_2c2;
  string local_2c0;
  undefined1 local_2a0 [8];
  _Alloc_hider local_298;
  undefined1 local_290 [8];
  char local_288 [16];
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined1 local_258 [32];
  format_string_checker<char> *local_238;
  parse_func local_230 [1];
  uint local_21c;
  CommissionerAppPtr local_218;
  string local_200;
  string local_1e0;
  ErrorCode local_1c0;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  ErrorCode local_198;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180 [16];
  ErrorCode local_170;
  undefined1 *local_168;
  long local_160;
  undefined1 local_158 [16];
  Error local_148;
  ErrorCode local_120 [2];
  long local_118;
  long local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  Error local_f8;
  Error local_d0;
  Error local_a8;
  Error local_80;
  Error local_58;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_218.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_218.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2e0 = aExpr;
  JobManager::GetSelectedCommissioner
            (&local_58,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_218);
  local_2a0._0_4_ = local_58.mCode;
  local_298._M_p = local_288;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_298,local_58.mMessage._M_dataplus._M_p,
             local_58.mMessage._M_dataplus._M_p + local_58.mMessage._M_string_length);
  local_2d8 = (string *)&(__return_storage_ptr__->mError).mMessage;
  local_270 = 0;
  local_268._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
  local_278._M_p = (pointer)&local_268;
  std::__cxx11::string::operator=(local_2d8,(string *)&local_298);
  local_2d0 = (string *)&__return_storage_ptr__->mData;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mData,(string *)&local_278);
  EVar1 = (__return_storage_ptr__->mError).mCode;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_p != &local_268) {
    operator_delete(local_278._M_p);
  }
  if (local_298._M_p != local_288) {
    operator_delete(local_298._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.mMessage._M_dataplus._M_p != &local_58.mMessage.field_2) {
    operator_delete(local_58.mMessage._M_dataplus._M_p);
  }
  if (EVar1 != kNone) goto LAB_0024227f;
  pbVar2 = (local_2e0->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(local_2e0->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    local_258._0_8_ = local_258._0_8_ & 0xffffffff00000000;
    local_258._8_8_ = "too few arguments";
    local_258._16_8_ = (_Base_ptr)0x11;
    local_258._24_8_ = (_Base_ptr)0x0;
    local_230[0] = (parse_func)0x0;
    pcVar9 = "too few arguments";
    local_238 = (format_string_checker<char> *)local_258;
    do {
      pcVar7 = pcVar9 + 1;
      if (*pcVar9 == '}') {
        if ((pcVar7 == "") || (*pcVar7 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar7 = pcVar9 + 2;
      }
      else if (*pcVar9 == '{') {
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar9,"",(format_string_checker<char> *)local_258);
      }
      pcVar9 = pcVar7;
    } while (pcVar7 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_258;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_2c0,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_170 = kInvalidArgs;
    local_168 = local_158;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,local_2c0._M_dataplus._M_p,
               local_2c0._M_dataplus._M_p + local_2c0._M_string_length);
    local_2a0._0_4_ = local_170;
    local_298._M_p = local_288;
    std::__cxx11::string::_M_construct<char*>((string *)&local_298,local_168,local_168 + local_160);
    local_270 = 0;
    local_268._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
    local_278._M_p = (pointer)&local_268;
    std::__cxx11::string::operator=(local_2d8,(string *)&local_298);
    std::__cxx11::string::operator=(local_2d0,(string *)&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != &local_268) {
      operator_delete(local_278._M_p);
    }
    if (local_298._M_p != local_288) {
      operator_delete(local_298._M_p);
    }
    if (local_168 != local_158) {
      operator_delete(local_168);
    }
    paVar5 = &local_2c0.field_2;
LAB_00241821:
    _Var11._M_p = (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             **)(paVar5->_M_local_buf + -0x10);
    if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)(paVar5->_M_local_buf + -0x10) == paVar5) goto LAB_0024227f;
  }
  else {
    paVar5 = &local_2c0.field_2;
    local_2c0._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"scan","");
    utils::ToLower((string *)local_2a0,pbVar2 + 1);
    utils::ToLower((string *)local_258,&local_2c0);
    uVar3 = local_258._0_8_;
    if (local_298._M_p == (pointer)local_258._8_8_) {
      if (local_298._M_p == (char *)0x0) {
        bVar12 = true;
      }
      else {
        iVar4 = bcmp((void *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(void *)local_258._0_8_,
                     (size_t)local_298._M_p);
        bVar12 = iVar4 == 0;
      }
    }
    else {
      bVar12 = false;
    }
    if ((undefined1 *)uVar3 != local_258 + 0x10) {
      operator_delete((void *)uVar3);
    }
    if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_290) {
      operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != paVar5) {
      operator_delete(local_2c0._M_dataplus._M_p);
    }
    if (bVar12) {
      pbVar2 = (local_2e0->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (0xc0 < (ulong)((long)(local_2e0->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2)) {
        utils::ParseInteger<unsigned_int>(&local_80,&local_21c,pbVar2 + 2);
        local_2a0._0_4_ = local_80.mCode;
        local_298._M_p = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_80.mMessage._M_dataplus._M_p,
                   local_80.mMessage._M_dataplus._M_p + local_80.mMessage._M_string_length);
        local_270 = 0;
        local_268._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
        local_278._M_p = (pointer)&local_268;
        std::__cxx11::string::operator=(local_2d8,(string *)&local_298);
        std::__cxx11::string::operator=(local_2d0,(string *)&local_278);
        EVar1 = (__return_storage_ptr__->mError).mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_p != &local_268) {
          operator_delete(local_278._M_p);
        }
        if (local_298._M_p != local_288) {
          operator_delete(local_298._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80.mMessage._M_dataplus._M_p != &local_80.mMessage.field_2) {
          operator_delete(local_80.mMessage._M_dataplus._M_p);
        }
        if (EVar1 != kNone) goto LAB_0024227f;
        utils::ParseInteger<unsigned_char>
                  (&local_a8,&local_2e1,
                   (local_2e0->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 3);
        local_2a0._0_4_ = local_a8.mCode;
        local_298._M_p = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_a8.mMessage._M_dataplus._M_p,
                   local_a8.mMessage._M_dataplus._M_p + local_a8.mMessage._M_string_length);
        local_270 = 0;
        local_268._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
        local_278._M_p = (pointer)&local_268;
        std::__cxx11::string::operator=(local_2d8,(string *)&local_298);
        std::__cxx11::string::operator=(local_2d0,(string *)&local_278);
        EVar1 = (__return_storage_ptr__->mError).mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_p != &local_268) {
          operator_delete(local_278._M_p);
        }
        if (local_298._M_p != local_288) {
          operator_delete(local_298._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8.mMessage._M_dataplus._M_p != &local_a8.mMessage.field_2) {
          operator_delete(local_a8.mMessage._M_dataplus._M_p);
        }
        if (EVar1 != kNone) goto LAB_0024227f;
        utils::ParseInteger<unsigned_short>
                  (&local_d0,&local_2c2,
                   (local_2e0->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 4);
        local_2a0._0_4_ = local_d0.mCode;
        local_298._M_p = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_d0.mMessage._M_dataplus._M_p,
                   local_d0.mMessage._M_dataplus._M_p + local_d0.mMessage._M_string_length);
        local_270 = 0;
        local_268._M_local_buf[0] = '\0';
        local_278._M_p = (pointer)&local_268;
        pVVar6 = Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
        EVar1 = (pVVar6->mError).mCode;
        Value::~Value((Value *)local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0.mMessage._M_dataplus._M_p != &local_d0.mMessage.field_2) {
          operator_delete(local_d0.mMessage._M_dataplus._M_p);
        }
        if (EVar1 != kNone) goto LAB_0024227f;
        utils::ParseInteger<unsigned_short>
                  (&local_f8,&local_2c4,
                   (local_2e0->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 5);
        local_2a0._0_4_ = local_f8.mCode;
        local_298._M_p = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_f8.mMessage._M_dataplus._M_p,
                   local_f8.mMessage._M_dataplus._M_p + local_f8.mMessage._M_string_length);
        local_270 = 0;
        local_268._M_local_buf[0] = '\0';
        local_278._M_p = (pointer)&local_268;
        pVVar6 = Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
        EVar1 = (pVVar6->mError).mCode;
        Value::~Value((Value *)local_2a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8.mMessage._M_dataplus._M_p != &local_f8.mMessage.field_2) {
          operator_delete(local_f8.mMessage._M_dataplus._M_p);
        }
        if (EVar1 != kNone) goto LAB_0024227f;
        (*((local_218.
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->super_CommissionerHandler)._vptr_CommissionerHandler[0x48])
                  (local_120,
                   local_218.
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,(ulong)local_21c,(ulong)local_2e1,(ulong)local_2c2,(ulong)local_2c4,
                   (local_2e0->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 6);
        local_2a0._0_4_ = local_120[0];
        local_298._M_p = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_118,local_110 + local_118);
        local_270 = 0;
        local_268._M_local_buf[0] = '\0';
        local_278._M_p = (pointer)&local_268;
        Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
        Value::~Value((Value *)local_2a0);
        paVar5 = &local_108;
        goto LAB_00241821;
      }
      local_258._0_8_ = local_258._0_8_ & 0xffffffff00000000;
      local_258._8_8_ = "too few arguments";
      local_258._16_8_ = (_Base_ptr)0x11;
      local_258._24_8_ = (_Base_ptr)0x0;
      local_230[0] = (parse_func)0x0;
      pcVar9 = "too few arguments";
      local_238 = (format_string_checker<char> *)local_258;
      do {
        pcVar7 = pcVar9 + 1;
        if (*pcVar9 == '}') {
          if ((pcVar7 == "") || (*pcVar7 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar7 = pcVar9 + 2;
        }
        else if (*pcVar9 == '{') {
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar9,"",(format_string_checker<char> *)local_258);
        }
        pcVar9 = pcVar7;
      } while (pcVar7 != "");
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)local_258;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_2c0,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_00);
      local_198 = kInvalidArgs;
      puVar8 = local_180;
      local_190 = puVar8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_2c0._M_dataplus._M_p,
                 local_2c0._M_dataplus._M_p + local_2c0._M_string_length);
      local_2a0._0_4_ = local_198;
      local_298._M_p = local_288;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_190,local_190 + local_188);
      local_270 = 0;
      local_268._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
      local_278._M_p = (pointer)&local_268;
      std::__cxx11::string::operator=(local_2d8,(string *)&local_298);
      std::__cxx11::string::operator=(local_2d0,(string *)&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_p != &local_268) {
        operator_delete(local_278._M_p);
      }
      puVar10 = local_190;
      if (local_298._M_p != local_288) {
        operator_delete(local_298._M_p);
        puVar10 = local_190;
      }
    }
    else {
      pbVar2 = (local_2e0->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_2c0._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"report","");
      utils::ToLower((string *)local_2a0,pbVar2 + 1);
      utils::ToLower((string *)local_258,&local_2c0);
      uVar3 = local_258._0_8_;
      if (local_298._M_p == (pointer)local_258._8_8_) {
        if (local_298._M_p == (char *)0x0) {
          bVar12 = true;
        }
        else {
          iVar4 = bcmp((void *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(void *)local_258._0_8_,
                       (size_t)local_298._M_p);
          bVar12 = iVar4 == 0;
        }
      }
      else {
        bVar12 = false;
      }
      if ((undefined1 *)uVar3 != local_258 + 0x10) {
        operator_delete((void *)uVar3);
      }
      if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_290) {
        operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p);
      }
      if (bVar12) {
        pbVar2 = (local_2e0->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(local_2e0->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
          iVar4 = (*((local_218.
                      super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x4a])();
          std::
          _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
          ::_Rb_tree((_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                      *)local_258,
                     (_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                      *)CONCAT44(extraout_var_00,iVar4));
          if (local_230[0] == (parse_func)0x0) {
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"null","");
          }
          else {
            EnergyReportMapToJson_abi_cxx11_(&local_200,(commissioner *)local_258,aEnergyReportMap);
          }
          Value::Value((Value *)local_2a0,&local_200);
          (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
          std::__cxx11::string::operator=(local_2d8,(string *)&local_298);
          std::__cxx11::string::operator=(local_2d0,(string *)&local_278);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_p != &local_268) {
            operator_delete(local_278._M_p);
          }
          if (local_298._M_p != local_288) {
            operator_delete(local_298._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_200._M_dataplus._M_p != &local_200.field_2) {
            operator_delete(local_200._M_dataplus._M_p);
          }
          std::
          _Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
          ::~_Rb_tree((_Rb_tree<ot::commissioner::Address,_std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>,_std::_Select1st<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                       *)local_258);
          goto LAB_0024227f;
        }
        local_258._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_258._8_8_ = (pointer)0x0;
        local_258._16_8_ = (_Base_ptr)0x0;
        Address::Set(&local_148,(Address *)local_258,pbVar2 + 2);
        local_2a0._0_4_ = local_148.mCode;
        local_298._M_p = local_288;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_148.mMessage._M_dataplus._M_p,
                   local_148.mMessage._M_dataplus._M_p + local_148.mMessage._M_string_length);
        local_270 = 0;
        local_268._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
        local_278._M_p = (pointer)&local_268;
        std::__cxx11::string::operator=(local_2d8,(string *)&local_298);
        std::__cxx11::string::operator=(local_2d0,(string *)&local_278);
        EVar1 = (__return_storage_ptr__->mError).mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_p != &local_268) {
          operator_delete(local_278._M_p);
        }
        if (local_298._M_p != local_288) {
          operator_delete(local_298._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148.mMessage._M_dataplus._M_p != &local_148.mMessage.field_2) {
          operator_delete(local_148.mMessage._M_dataplus._M_p);
        }
        if (EVar1 == kNone) {
          iVar4 = (*((local_218.
                      super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->super_CommissionerHandler)._vptr_CommissionerHandler[0x49])
                            (local_218.
                             super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,local_258);
          if ((commissioner *)CONCAT44(extraout_var,iVar4) == (commissioner *)0x0) {
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"null","");
          }
          else {
            EnergyReportToJson_abi_cxx11_
                      (&local_1e0,(commissioner *)CONCAT44(extraout_var,iVar4),aEnergyReport);
          }
          Value::Value((Value *)local_2a0,&local_1e0);
          Value::operator=(__return_storage_ptr__,(Value *)local_2a0);
          Value::~Value((Value *)local_2a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p);
          }
        }
        _Var11._M_p = (pointer)local_258._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) goto LAB_0024227f;
        goto LAB_0024227a;
      }
      local_258._0_4_ = string_type;
      local_258._8_8_ = "\'{}\' is not a valid sub-command";
      local_258._16_8_ = (_Base_ptr)0x1f;
      local_258._24_8_ = (_Base_ptr)0x100000000;
      local_230[0] = ::fmt::v10::detail::
                     parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar9 = "\'{}\' is not a valid sub-command";
      local_238 = (format_string_checker<char> *)local_258;
      do {
        pcVar7 = pcVar9 + 1;
        if (*pcVar9 == '}') {
          if ((pcVar7 == "") || (*pcVar7 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar7 = pcVar9 + 2;
        }
        else if (*pcVar9 == '{') {
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar9,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_258);
        }
        pcVar9 = pcVar7;
      } while (pcVar7 != "");
      pbVar2 = (local_2e0->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_258._0_8_ = pbVar2[1]._M_dataplus._M_p;
      local_258._8_8_ = pbVar2[1]._M_string_length;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_258;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x1f;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_2c0,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_01);
      local_1c0 = kInvalidCommand;
      puVar8 = local_1a8;
      local_1b8 = puVar8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,local_2c0._M_dataplus._M_p,
                 local_2c0._M_dataplus._M_p + local_2c0._M_string_length);
      local_2a0._0_4_ = local_1c0;
      local_298._M_p = local_288;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_1b8,local_1b8 + local_1b0);
      local_270 = 0;
      local_268._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_2a0._0_4_;
      local_278._M_p = (pointer)&local_268;
      std::__cxx11::string::operator=(local_2d8,(string *)&local_298);
      std::__cxx11::string::operator=(local_2d0,(string *)&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_p != &local_268) {
        operator_delete(local_278._M_p);
      }
      puVar10 = local_1b8;
      if (local_298._M_p != local_288) {
        operator_delete(local_298._M_p);
        puVar10 = local_1b8;
      }
    }
    if (puVar10 != puVar8) {
      operator_delete(puVar10);
    }
    _Var11._M_p = local_2c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p == &local_2c0.field_2) goto LAB_0024227f;
  }
LAB_0024227a:
  operator_delete(_Var11._M_p);
LAB_0024227f:
  if (local_218.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_218.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessEnergy(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "scan"))
    {
        uint32_t channelMask;
        uint8_t  count;
        uint16_t period;
        uint16_t scanDuration;
        VerifyOrExit(aExpr.size() >= 7, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(channelMask, aExpr[2]));
        SuccessOrExit(value = ParseInteger(count, aExpr[3]));
        SuccessOrExit(value = ParseInteger(period, aExpr[4]));
        SuccessOrExit(value = ParseInteger(scanDuration, aExpr[5]));
        SuccessOrExit(value = commissioner->EnergyScan(channelMask, count, period, scanDuration, aExpr[6]));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "report"))
    {
        if (aExpr.size() >= 3)
        {
            const EnergyReport *report = nullptr;
            Address             dstAddr;
            SuccessOrExit(value = dstAddr.Set(aExpr[2]));
            report = commissioner->GetEnergyReport(dstAddr);
            value  = report == nullptr ? "null" : EnergyReportToJson(*report);
        }
        else
        {
            auto reports = commissioner->GetAllEnergyReports();
            value        = reports.empty() ? "null" : EnergyReportMapToJson(reports);
        }
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}